

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall testing::internal::CapturedStream::CapturedStream(CapturedStream *this,int fd)

{
  char *pcVar1;
  int iVar2;
  char name_template [28];
  char acStack_58 [40];
  
  this->fd_ = fd;
  iVar2 = dup(fd);
  this->uncaptured_fd_ = iVar2;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  builtin_strncpy(acStack_58 + 0x10,"ream.XXXXXX",0xc);
  builtin_strncpy(acStack_58,"/tmp/captured_st",0x10);
  iVar2 = mkstemp(acStack_58);
  pcVar1 = (char *)(this->filename_)._M_string_length;
  strlen(acStack_58);
  std::__cxx11::string::_M_replace((ulong)&this->filename_,0,pcVar1,(ulong)acStack_58);
  fflush((FILE *)0x0);
  dup2(iVar2,this->fd_);
  close(iVar2);
  return;
}

Assistant:

explicit CapturedStream(int fd) : fd_(fd), uncaptured_fd_(dup(fd)) {
# if GTEST_OS_WINDOWS
    char temp_dir_path[MAX_PATH + 1] = { '\0' };  // NOLINT
    char temp_file_path[MAX_PATH + 1] = { '\0' };  // NOLINT

    ::GetTempPathA(sizeof(temp_dir_path), temp_dir_path);
    const UINT success = ::GetTempFileNameA(temp_dir_path,
                                            "gtest_redir",
                                            0,  // Generate unique file name.
                                            temp_file_path);
    GTEST_CHECK_(success != 0)
        << "Unable to create a temporary file in " << temp_dir_path;
    const int captured_fd = creat(temp_file_path, _S_IREAD | _S_IWRITE);
    GTEST_CHECK_(captured_fd != -1) << "Unable to open temporary file "
                                    << temp_file_path;
    filename_ = temp_file_path;
# else
    // There's no guarantee that a test has write access to the current
    // directory, so we create the temporary file in the /tmp directory
    // instead. We use /tmp on most systems, and /sdcard on Android.
    // That's because Android doesn't have /tmp.
#  if GTEST_OS_LINUX_ANDROID
    // Note: Android applications are expected to call the framework's
    // Context.getExternalStorageDirectory() method through JNI to get
    // the location of the world-writable SD Card directory. However,
    // this requires a Context handle, which cannot be retrieved
    // globally from native code. Doing so also precludes running the
    // code as part of a regular standalone executable, which doesn't
    // run in a Dalvik process (e.g. when running it through 'adb shell').
    //
    // The location /sdcard is directly accessible from native code
    // and is the only location (unofficially) supported by the Android
    // team. It's generally a symlink to the real SD Card mount point
    // which can be /mnt/sdcard, /mnt/sdcard0, /system/media/sdcard, or
    // other OEM-customized locations. Never rely on these, and always
    // use /sdcard.
    char name_template[] = "/sdcard/gtest_captured_stream.XXXXXX";
#  else
    char name_template[] = "/tmp/captured_stream.XXXXXX";
#  endif  // GTEST_OS_LINUX_ANDROID
    const int captured_fd = mkstemp(name_template);
    filename_ = name_template;
# endif  // GTEST_OS_WINDOWS
    fflush(NULL);
    dup2(captured_fd, fd_);
    close(captured_fd);
  }